

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_change_item_quantity(command *cmd)

{
  byte bVar1;
  ushort uVar2;
  player *p;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint16_t uVar6;
  char *fmt;
  object *obj;
  wchar_t n;
  wchar_t update;
  char s [80];
  char prompt [80];
  object *local_d8;
  wchar_t local_d0;
  int local_cc;
  char local_c8 [80];
  char local_78 [80];
  
  local_cc = 0;
  wVar4 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_d8);
  if (wVar4 == L'\0') {
    _Var3 = object_is_equipped(player->body,local_d8);
    if (_Var3) {
      fmt = "Can not change the quantity of an equipped item.";
      goto LAB_00131e5a;
    }
  }
  else {
    _Var3 = get_item(&local_d8,"Change quantity of which item? ","You have nothing to change.",
                     cmd->code,(item_tester)0x0,L'\x0e');
    if (!_Var3) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",local_d8);
  }
  if (local_d8->artifact == (artifact *)0x0) {
    wVar4 = local_d8->kind->base->max_stack;
    _Var3 = tval_can_have_charges(local_d8);
    if ((_Var3) && (0 < local_d8->pval)) {
      bVar1 = local_d8->number;
      if ((bVar1 != 0) &&
         (wVar5 = ((uint)bVar1 * 0x8000 - (uint)bVar1) / (uint)(int)local_d8->pval, wVar5 < wVar4))
      {
        wVar4 = wVar5;
      }
    }
    _Var3 = object_is_in_quiver(player,local_d8);
    if (_Var3) {
      uVar2 = z_info->quiver_slot_size;
      _Var3 = tval_is_ammo(local_d8);
      uVar6 = 1;
      if (!_Var3) {
        uVar6 = z_info->thrown_quiver_mult;
      }
      if ((int)((uint)uVar2 / (uint)uVar6) <= wVar4) {
        uVar2 = z_info->quiver_slot_size;
        _Var3 = tval_is_ammo(local_d8);
        uVar6 = 1;
        if (!_Var3) {
          uVar6 = z_info->thrown_quiver_mult;
        }
        wVar4 = (wchar_t)(uVar2 / uVar6);
      }
    }
    wVar5 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_d0);
    if (wVar5 != L'\0') {
      strnfmt(local_78,0x50,"Quantity (1-%d): ",(ulong)(uint)wVar4);
      strnfmt(local_c8,0x50,"%d",(ulong)local_d8->number);
      _Var3 = get_string(local_78,local_c8,0x50);
      if (!_Var3) {
        return;
      }
      _Var3 = get_int_from_string(local_c8,&local_d0);
      if (local_d0 < L'\x01' || !_Var3) {
        return;
      }
      if (local_d8->kind->base->max_stack < local_d0) {
        return;
      }
      cmd_set_arg_number((command_conflict *)cmd,"quantity",local_d0);
    }
    wVar5 = local_d0;
    if (wVar4 < local_d0) {
      wVar5 = wVar4;
    }
    local_d0 = L'\x01';
    if (L'\x01' < wVar5) {
      local_d0 = wVar5;
    }
    if (local_d0 == (uint)local_d8->number) {
      return;
    }
    _Var3 = tval_can_have_charges(local_d8);
    if ((_Var3) && (local_d8->number != 0)) {
      local_d8->pval = (int16_t)((local_d8->pval * local_d0) / (int)(uint)local_d8->number);
    }
    _Var3 = tval_can_have_timeout(local_d8);
    if ((_Var3) && (local_d8->number != 0)) {
      local_d8->timeout = (int16_t)((local_d8->timeout * local_d0) / (int)(uint)local_d8->number);
    }
    wVar4 = cmd_get_arg_choice((command_conflict *)cmd,"update",&local_cc);
    if (wVar4 == L'\0' && local_cc == 0) {
      wiz_play_item_notify_changed();
    }
    else {
      _Var3 = object_is_carried(player,local_d8);
      p = player;
      if (_Var3) {
        player->upkeep->total_weight =
             local_d8->weight * local_d0 +
             (player->upkeep->total_weight - (uint)local_d8->number * (int)local_d8->weight);
      }
      wiz_play_item_standard_upkeep(p,local_d8);
    }
    local_d8->number = (uint8_t)local_d0;
    return;
  }
  fmt = "Can not modify the quantity of an artifact.";
LAB_00131e5a:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_wiz_change_item_quantity(struct command *cmd)
{
	struct object *obj;
	int n, nmax;
	int update = 0;

	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Change quantity of which item? ",
				"You have nothing to change.", cmd->code,
				NULL, (USE_INVEN | USE_QUIVER | USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	} else if (object_is_equipped(player->body, obj)) {
		msg("Can not change the quantity of an equipped item.");
		return;
	}

	/* Don't allow multiple artifacts. */
	if (obj->artifact) {
		msg("Can not modify the quantity of an artifact.");
		return;
	}

	/* Find limit on stack size. */
	nmax = obj->kind->base->max_stack;
	if (tval_can_have_charges(obj) && obj->pval > 0 && obj->number > 0) {
		/* Items with charges have a limit imposed by MAX_PVAL. */
		nmax = MIN((MAX_PVAL * obj->number) / obj->pval, nmax);
	}
	if (object_is_in_quiver(player, obj)) {
		/* The quiver may have stricter limits. */
		nmax = MIN(z_info->quiver_slot_size /
			(tval_is_ammo(obj) ? 1 : z_info->thrown_quiver_mult),
			nmax);
	}

	/* Get the new quantity. */
	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		char prompt[80], s[80];

		strnfmt(prompt, sizeof(prompt), "Quantity (1-%d): ", nmax);

		/* Set the default value. */
		strnfmt(s, sizeof(s), "%d", obj->number);

		if (!get_string(prompt, s, sizeof(s)) ||
				!get_int_from_string(s, &n) ||
				n < 1 || n > obj->kind->base->max_stack) {
			return;
		}

		cmd_set_arg_number(cmd, "quantity", n);
	}

	/* Impose limits. */
	n = MAX(1, MIN(nmax, n));

	if (n != obj->number) {
		/* Adjust charges or timeouts for devices. */
		if (tval_can_have_charges(obj) && obj->number > 0) {
			obj->pval = (obj->pval * n) / obj->number;
		}
		if (tval_can_have_timeout(obj) && obj->number > 0) {
			obj->timeout = (obj->timeout * n) / obj->number;
		}

		/* Accept change. */
		if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK ||
				update) {
			if (object_is_carried(player, obj)) {
				/*
				 * Remove the weight of the old number of
				 * objects.
				 */
				player->upkeep->total_weight -=
					obj->number * obj->weight;

				/*
				 * Add the weight of the new number of objects.
				 */
				player->upkeep->total_weight += n * obj->weight;
			}
			wiz_play_item_standard_upkeep(player, obj);
		} else {
			wiz_play_item_notify_changed();
		}
		obj->number = n;
	}
}